

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::DeleteProperty
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          JavascriptString *propertyNameString,PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  unsigned_short uVar4;
  charcount_t cVar5;
  PropertyId propertyId;
  BOOL BVar6;
  char16 *pcVar7;
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this_03;
  undefined4 *puVar8;
  RecyclableObject *value;
  Type *this_04;
  unsigned_short dataSlot;
  Var undefined;
  undefined1 local_58 [8];
  CharacterBuffer<char16_t> propertyName;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  PropertyOperationFlags propertyOperationFlags_local;
  JavascriptString *propertyNameString_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  pcVar7 = JavascriptString::GetString(propertyNameString);
  cVar5 = JavascriptString::GetLength(propertyNameString);
  bVar2 = PropertyRecord::IsPropertyNameNumeric(pcVar7,cVar5);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x3a3,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* "
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  this_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  this_01 = ScriptContext::GetLibrary(this_00);
  pcVar7 = JavascriptString::GetString(propertyNameString);
  cVar5 = JavascriptString::GetLength(propertyNameString);
  JsUtil::CharacterBuffer<char16_t>::CharacterBuffer
            ((CharacterBuffer<char16_t> *)local_58,pcVar7,cVar5);
  this_02 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_02,(CharacterBuffer<char16_t> *)local_58,
                     (DictionaryPropertyDescriptor<unsigned_short> **)&propertyName.len);
  if (bVar2) {
    bVar2 = DynamicTypeHandler::GetHasSpecialProperties(&this->super_DynamicTypeHandler);
    if ((!bVar2) &&
       (bVar2 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyNameString), bVar2))
    {
      DynamicTypeHandler::SetHasSpecialProperties(&this->super_DynamicTypeHandler);
      bVar3 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
      if ((bVar3 & 0x20) != 0) {
        JavascriptLibrary::GetTypesWithNoSpecialPropertyProtoChainCache
                  ((JavascriptLibrary *)&undefined);
        this_03 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
                  operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>
                              *)&undefined);
        PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(this_03);
      }
    }
    bVar2 = DictionaryPropertyDescriptor<unsigned_short>::SanityCheckFixedBits
                      ((DictionaryPropertyDescriptor<unsigned_short> *)propertyName._8_8_);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x3b7,"(descriptor->SanityCheckFixedBits())",
                                  "descriptor->SanityCheckFixedBits()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if ((*(byte *)(propertyName._8_8_ + 1) & 8) == 0) {
      if ((*(byte *)(propertyName._8_8_ + 1) & 2) == 0) {
        pcVar7 = JavascriptString::GetString(propertyNameString);
        JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
                  (propertyOperationFlags,this_00,pcVar7);
        this_local._4_4_ = 0;
      }
      else {
        value = JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
        bVar2 = DictionaryPropertyDescriptor<unsigned_short>::HasNonLetConstGlobal
                          ((DictionaryPropertyDescriptor<unsigned_short> *)propertyName._8_8_);
        if (bVar2) {
          uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>
                            ((DictionaryPropertyDescriptor<unsigned_short> *)propertyName._8_8_);
          if (uVar4 == 0xffff) {
            bVar2 = DictionaryPropertyDescriptor<unsigned_short>::GetIsAccessor
                              ((DictionaryPropertyDescriptor<unsigned_short> *)propertyName._8_8_);
            if (!bVar2) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                          ,0x3d1,"(descriptor->GetIsAccessor())",
                                          "descriptor->GetIsAccessor()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
            }
            uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex
                              ((DictionaryPropertyDescriptor<unsigned_short> *)propertyName._8_8_);
            DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar4,value);
            uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                              ((DictionaryPropertyDescriptor<unsigned_short> *)propertyName._8_8_);
            DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar4,value);
          }
          else {
            DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar4,value);
          }
          bVar3 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
          if ((bVar3 & 0x20) != 0) {
            pcVar7 = JavascriptString::GetString(propertyNameString);
            cVar5 = JavascriptString::GetLength(propertyNameString);
            propertyId = ScriptContext::GetOrAddPropertyIdTracked(this_00,pcVar7,cVar5);
            ScriptContext::InvalidateProtoCaches(this_00,propertyId);
          }
          if ((*(byte *)(propertyName._8_8_ + 1) & 0x10) == 0) {
            bVar2 = DictionaryPropertyDescriptor<unsigned_short>::GetIsShadowed
                              ((DictionaryPropertyDescriptor<unsigned_short> *)propertyName._8_8_);
            if (bVar2) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                          ,0x3dd,"(!descriptor->GetIsShadowed())",
                                          "!descriptor->GetIsShadowed()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
            }
            *(undefined1 *)(propertyName._8_8_ + 1) = 0xe;
          }
          else {
            *(byte *)(propertyName._8_8_ + 1) = *(byte *)(propertyName._8_8_ + 1) & 0xf8;
            *(byte *)(propertyName._8_8_ + 1) = *(byte *)(propertyName._8_8_ + 1) | 0xe;
          }
          InvalidateFixedField<Js::JavascriptString*>
                    (this,instance,propertyNameString,
                     (DictionaryPropertyDescriptor<unsigned_short> *)propertyName._8_8_);
          this_04 = RecyclableObject::GetType(&instance->super_RecyclableObject);
          BVar6 = Js::Type::HasBeenCached(this_04);
          if (BVar6 != 0) {
            DynamicObject::ChangeType(instance);
          }
          DynamicTypeHandler::SetPropertyUpdateSideEffect
                    (&this->super_DynamicTypeHandler,instance,(CharacterBuffer<char16_t> *)local_58,
                     (Var)0x0,SideEffects_Any);
          this_local._4_4_ = 1;
        }
        else {
          if ((*(byte *)(propertyName._8_8_ + 1) & 0x10) == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                        ,0x3f2,"(descriptor->Attributes & 0x10)",
                                        "descriptor->Attributes & PropertyLetConstGlobal");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          this_local._4_4_ = 0;
        }
      }
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::DeleteProperty(DynamicObject *instance, JavascriptString *propertyNameString, PropertyOperationFlags propertyOperationFlags)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* ");

        ScriptContext* scriptContext = instance->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();
        DictionaryPropertyDescriptor<T>* descriptor;
        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());

        if (propertyMap->TryGetReference(propertyName, &descriptor))
        {
            if (!this->GetHasSpecialProperties() && NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyNameString))
            {
                // If you are deleting a valueOf/toString and the flag wasn't set, it means you are deleting the default
                // implementation off of Object.prototype
                this->SetHasSpecialProperties();
                if (GetFlags() & IsPrototypeFlag)
                {
                    library->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
                }
            }
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                return true;
            }
            else if (!(descriptor->Attributes & PropertyConfigurable))
            {
                // Let/const properties do not have attributes and they cannot be deleted
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, scriptContext, propertyNameString->GetString());

                return false;
            }

            Var undefined = library->GetUndefined();

            if (descriptor->HasNonLetConstGlobal())
            {
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetSlotUnchecked(instance, dataSlot, undefined);
                }
                else
                {
                    Assert(descriptor->GetIsAccessor());
                    SetSlotUnchecked(instance, descriptor->GetGetterPropertyIndex(), undefined);
                    SetSlotUnchecked(instance, descriptor->GetSetterPropertyIndex(), undefined);
                }

                if (this->GetFlags() & IsPrototypeFlag)
                {
                    scriptContext->InvalidateProtoCaches(scriptContext->GetOrAddPropertyIdTracked(propertyNameString->GetString(), propertyNameString->GetLength()));
                }

                if ((descriptor->Attributes & PropertyLetConstGlobal) == 0)
                {
                    Assert(!descriptor->GetIsShadowed());
                    descriptor->Attributes = PropertyDeletedDefaults;
                }
                else
                {
                    descriptor->Attributes &= ~PropertyDynamicTypeDefaults;
                    descriptor->Attributes |= PropertyDeletedDefaults;
                }
#if ENABLE_FIXED_FIELDS
                InvalidateFixedField(instance, propertyNameString, descriptor);
#endif

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyName, nullptr, SideEffects_Any);
                return true;
            }

            Assert(descriptor->Attributes & PropertyLetConstGlobal);
            return false;
        }

        return true;
    }